

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cc
# Opt level: O0

void __thiscall
testbench::anon_unknown_2::general_RAM::general_RAM(general_RAM *this,uint start_address,uint size)

{
  ulong __n;
  allocator<unsigned_char> local_19;
  uint local_18;
  uint local_14;
  uint size_local;
  uint start_address_local;
  general_RAM *this_local;
  
  local_18 = size;
  local_14 = start_address;
  _size_local = this;
  address_range::address_range(&this->super_address_range);
  (this->super_address_range)._vptr_address_range = (_func_int **)&PTR_is_writable_00118990;
  this->start = local_14;
  __n = (ulong)local_18;
  std::allocator<unsigned_char>::allocator(&local_19);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->data,__n,&local_19);
  std::allocator<unsigned_char>::~allocator(&local_19);
  return;
}

Assistant:

general_RAM(unsigned start_address, unsigned size):
        start(start_address),
        data(size)
    { }